

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O1

char * s3get_gvn_fattr(char *a)

{
  long lVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = attrib[0] == (char *)0x0;
  if (bVar4) {
    lVar3 = 0;
  }
  else {
    iVar2 = strcmp(attrib[0],a);
    if (iVar2 == 0) {
      lVar3 = 0;
    }
    else {
      lVar1 = 1;
      do {
        lVar3 = lVar1;
        bVar4 = attrib[lVar3] == (char *)0x0;
        if (bVar4) goto LAB_00105609;
        iVar2 = strcmp(attrib[lVar3],a);
        lVar1 = lVar3 + 1;
      } while (iVar2 != 0);
    }
    if (!bVar4) goto LAB_00105617;
  }
LAB_00105609:
  if (value[lVar3] != (char *)0x0) {
    __assert_fail("(attrib[i] != NULL) || (value[i] == NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                  ,0x5f,"char *s3get_gvn_fattr(char *)");
  }
LAB_00105617:
  return value[lVar3];
}

Assistant:

char *
s3get_gvn_fattr(char *a)
{
    int i;

    for (i = 0; attrib[i] && strcmp(attrib[i], a) != 0; i++);

    /* value for sentinel is null as well */
    assert((attrib[i] != NULL) || (value[i] == NULL));

    return value[i];
}